

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

string * common::StringForFeeReason_abi_cxx11_(FeeReason reason)

{
  initializer_list<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  iterator in_RDI;
  long in_FS_OFFSET;
  const_iterator reason_string;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdb0;
  _Self *in_stack_fffffffffffffdb8;
  char (*in_stack_fffffffffffffdd0) [42];
  FeeReason *in_stack_fffffffffffffdd8;
  pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  size_type in_stack_fffffffffffffe18;
  allocator<char> local_1b1;
  _Base_ptr local_1b0;
  _Base_ptr local_1a8;
  undefined1 local_19a [402];
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  if (StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&StringForFeeReason[abi:cxx11](FeeReason)::
                                 fee_reason_strings_abi_cxx11_);
    if (iVar2 != 0) {
      local_19a._34_4_ = 0;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[5],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [5])in_stack_fffffffffffffdd0);
      local_19a._30_4_ = 1;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[26],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [26])in_stack_fffffffffffffdd0);
      local_19a._26_4_ = 2;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[21],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [21])in_stack_fffffffffffffdd0);
      local_19a._22_4_ = 3;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[28],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [28])in_stack_fffffffffffffdd0);
      local_19a._18_4_ = 4;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[42],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      local_19a._14_4_ = 5;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[16],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [16])in_stack_fffffffffffffdd0);
      local_19a._10_4_ = 6;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[13],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [13])in_stack_fffffffffffffdd0);
      local_19a._6_4_ = 7;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[13],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [13])in_stack_fffffffffffffdd0);
      local_19a._2_4_ = 8;
      std::
      pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<FeeReason,_const_char_(&)[21],_true>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (char (*) [21])in_stack_fffffffffffffdd0);
      this = (map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_19a;
      std::
      allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffda8);
      __l._M_len = in_stack_fffffffffffffe18;
      __l._M_array = in_RDI;
      std::
      map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(this,__l,(less<FeeReason> *)in_stack_fffffffffffffdf8,
            (allocator_type *)in_stack_fffffffffffffdf0);
      std::
      allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffda8);
      in_stack_fffffffffffffdf0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_19a + 0x2a);
      in_stack_fffffffffffffde8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffff8;
      do {
        in_stack_fffffffffffffde8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&in_stack_fffffffffffffde8[-2].field_2 + 8);
        std::
        pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffda8);
      } while (in_stack_fffffffffffffde8 != in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffdf8 = in_stack_fffffffffffffde8;
      __cxa_atexit(std::
                   map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&StringForFeeReason[abi:cxx11](FeeReason)::fee_reason_strings_abi_cxx11_);
    }
  }
  local_1a8 = (_Base_ptr)
              std::
              map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->first);
  local_1b0 = (_Base_ptr)
              std::
              map<FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FeeReason>,_std::allocator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(in_stack_fffffffffffffdb0);
  bVar1 = std::operator==(in_stack_fffffffffffffdb8,(_Self *)in_stack_fffffffffffffdb0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
               (allocator<char> *)in_stack_fffffffffffffde8);
    std::allocator<char>::~allocator(&local_1b1);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_FeeReason,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffda8);
    std::__cxx11::string::string(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return (string *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string StringForFeeReason(FeeReason reason)
{
    static const std::map<FeeReason, std::string> fee_reason_strings = {
        {FeeReason::NONE, "None"},
        {FeeReason::HALF_ESTIMATE, "Half Target 60% Threshold"},
        {FeeReason::FULL_ESTIMATE, "Target 85% Threshold"},
        {FeeReason::DOUBLE_ESTIMATE, "Double Target 95% Threshold"},
        {FeeReason::CONSERVATIVE, "Conservative Double Target longer horizon"},
        {FeeReason::MEMPOOL_MIN, "Mempool Min Fee"},
        {FeeReason::PAYTXFEE, "PayTxFee set"},
        {FeeReason::FALLBACK, "Fallback fee"},
        {FeeReason::REQUIRED, "Minimum Required Fee"},
    };
    auto reason_string = fee_reason_strings.find(reason);

    if (reason_string == fee_reason_strings.end()) return "Unknown";

    return reason_string->second;
}